

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::protos::gen::FtraceConfig::Serialize(FtraceConfig *this,Message *msg)

{
  pointer pbVar1;
  _Head_base<0UL,_perfetto::protos::gen::FtraceConfig_CompactSchedConfig_*,_false> this_00;
  uint8_t *src_begin;
  uint uVar2;
  Message *msg_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  pointer pbVar3;
  
  pbVar1 = (this->ftrace_events_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->ftrace_events_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    protozero::Message::AppendBytes(msg,1,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
  }
  pbVar1 = (this->atrace_categories_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->atrace_categories_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    protozero::Message::AppendBytes(msg,2,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
  }
  pbVar1 = (this->atrace_apps_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->atrace_apps_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    protozero::Message::AppendBytes(msg,3,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
  }
  uVar2 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  if ((uVar2 >> 10 & 1) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,10,this->buffer_size_kb_);
    uVar2 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 >> 0xb & 1) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,0xb,this->drain_period_ms_);
    uVar2 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    this_00._M_head_impl =
         (this->compact_sched_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::FtraceConfig_CompactSchedConfig,_std::default_delete<perfetto::protos::gen::FtraceConfig_CompactSchedConfig>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::FtraceConfig_CompactSchedConfig_*,_std::default_delete<perfetto::protos::gen::FtraceConfig_CompactSchedConfig>_>
         .super__Head_base<0UL,_perfetto::protos::gen::FtraceConfig_CompactSchedConfig_*,_false>.
         _M_head_impl;
    msg_00 = protozero::Message::BeginNestedMessageInternal(msg,0xc);
    FtraceConfig_CompactSchedConfig::Serialize(this_00._M_head_impl,msg_00);
    uVar2 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    protozero::Message::AppendTinyVarInt(msg,0xd,(uint)this->symbolize_ksyms_);
    uVar2 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 >> 0xe & 1) != 0) {
    protozero::Message::AppendTinyVarInt
              (msg,0xe,(uint)this->initialize_ksyms_synchronously_for_testing_);
    uVar2 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((short)uVar2 < 0) {
    protozero::Message::AppendTinyVarInt(msg,0xf,(uint)this->throttle_rss_stat_);
    uVar2 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    protozero::Message::AppendTinyVarInt(msg,0x10,(uint)this->disable_generic_events_);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void FtraceConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: ftrace_events
  for (auto& it : ftrace_events_) {
    msg->AppendString(1, it);
  }

  // Field 2: atrace_categories
  for (auto& it : atrace_categories_) {
    msg->AppendString(2, it);
  }

  // Field 3: atrace_apps
  for (auto& it : atrace_apps_) {
    msg->AppendString(3, it);
  }

  // Field 10: buffer_size_kb
  if (_has_field_[10]) {
    msg->AppendVarInt(10, buffer_size_kb_);
  }

  // Field 11: drain_period_ms
  if (_has_field_[11]) {
    msg->AppendVarInt(11, drain_period_ms_);
  }

  // Field 12: compact_sched
  if (_has_field_[12]) {
    (*compact_sched_).Serialize(msg->BeginNestedMessage<::protozero::Message>(12));
  }

  // Field 13: symbolize_ksyms
  if (_has_field_[13]) {
    msg->AppendTinyVarInt(13, symbolize_ksyms_);
  }

  // Field 14: initialize_ksyms_synchronously_for_testing
  if (_has_field_[14]) {
    msg->AppendTinyVarInt(14, initialize_ksyms_synchronously_for_testing_);
  }

  // Field 15: throttle_rss_stat
  if (_has_field_[15]) {
    msg->AppendTinyVarInt(15, throttle_rss_stat_);
  }

  // Field 16: disable_generic_events
  if (_has_field_[16]) {
    msg->AppendTinyVarInt(16, disable_generic_events_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}